

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_stmt_status(sqlite3_stmt *pStmt,int op,int resetFlag)

{
  int in_EDX;
  int in_ESI;
  Vdbe *in_RDI;
  sqlite3 *db;
  u32 v;
  Vdbe *pVdbe;
  sqlite3 *p;
  undefined4 in_stack_ffffffffffffffe0;
  u32 uVar1;
  
  if (in_ESI == 99) {
    p = in_RDI->db;
    sqlite3_mutex_enter((sqlite3_mutex *)0x136f1b);
    uVar1 = 0;
    p->pnBytesFreed = (int *)&stack0xffffffffffffffe4;
    sqlite3VdbeClearObject((sqlite3 *)CONCAT44(in_ESI,in_EDX),in_RDI);
    sqlite3DbFree((sqlite3 *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),p);
    p->pnBytesFreed = (int *)0x0;
    sqlite3_mutex_leave((sqlite3_mutex *)0x136f6b);
  }
  else {
    uVar1 = in_RDI->aCounter[in_ESI];
    if (in_EDX != 0) {
      in_RDI->aCounter[in_ESI] = 0;
    }
  }
  return uVar1;
}

Assistant:

SQLITE_API int sqlite3_stmt_status(sqlite3_stmt *pStmt, int op, int resetFlag){
  Vdbe *pVdbe = (Vdbe*)pStmt;
  u32 v;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !pStmt 
   || (op!=SQLITE_STMTSTATUS_MEMUSED && (op<0||op>=ArraySize(pVdbe->aCounter)))
  ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  if( op==SQLITE_STMTSTATUS_MEMUSED ){
    sqlite3 *db = pVdbe->db;
    sqlite3_mutex_enter(db->mutex);
    v = 0;
    db->pnBytesFreed = (int*)&v;
    sqlite3VdbeClearObject(db, pVdbe);
    sqlite3DbFree(db, pVdbe);
    db->pnBytesFreed = 0;
    sqlite3_mutex_leave(db->mutex);
  }else{
    v = pVdbe->aCounter[op];
    if( resetFlag ) pVdbe->aCounter[op] = 0;
  }
  return (int)v;
}